

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

bool basisu::string_split_path(char *p,string *pDrive,string *pDir,string *pFilename,string *pExt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__s;
  char *__s_00;
  ulong __n;
  char nametmp [1024];
  char dirtmp [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  char local_838 [1023];
  undefined1 local_439;
  char local_438 [1023];
  undefined1 local_39;
  
  if (p != (char *)0x0) {
    sVar6 = strlen(p);
    __n = sVar6 + 1;
    if (__n < 0x401) {
      memcpy(local_438,p,__n);
      memcpy(local_838,p,__n);
    }
    else {
      memcpy(local_438,p,0x3ff);
      local_39 = 0;
      memcpy(local_838,p,0x3ff);
      local_439 = 0;
    }
    if (pDrive != (string *)0x0) {
      std::__cxx11::string::resize((ulong)pDrive,'\0');
    }
    __s = dirname(local_438);
    __s_00 = __xpg_basename(local_838);
    if (__s_00 != (char *)0x0 && __s != (char *)0x0) {
      if (pDir != (string *)0x0) {
        pcVar2 = (char *)pDir->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)pDir,0,pcVar2,(ulong)__s);
        if ((pDir->_M_string_length != 0) &&
           ((pDir->_M_dataplus)._M_p[pDir->_M_string_length - 1] != '/')) {
          std::__cxx11::string::append((char *)pDir);
        }
      }
      if (pFilename != (string *)0x0) {
        pcVar2 = (char *)pFilename->_M_string_length;
        strlen(__s_00);
        std::__cxx11::string::_M_replace((ulong)pFilename,0,pcVar2,(ulong)__s_00);
        iVar4 = std::__cxx11::string::rfind((char)pFilename,0x2f);
        iVar5 = std::__cxx11::string::rfind((char)pFilename,0x2e);
        if (-1 < iVar5 && iVar4 <= iVar5) {
          std::__cxx11::string::resize((ulong)pFilename,(char)iVar5);
        }
      }
      if (pExt != (string *)0x0) {
        pcVar2 = (char *)pExt->_M_string_length;
        strlen(__s_00);
        std::__cxx11::string::_M_replace((ulong)pExt,0,pcVar2,(ulong)__s_00);
        iVar4 = std::__cxx11::string::rfind((char)pExt,0x2f);
        iVar5 = std::__cxx11::string::rfind((char)pExt,0x2e);
        paVar1 = &local_858.field_2;
        local_858._M_dataplus._M_p = (pointer)paVar1;
        if (iVar4 < iVar5) {
          pcVar3 = (pExt->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_858,pcVar3,pcVar3 + pExt->_M_string_length);
          std::__cxx11::string::erase((ulong)&local_858,0);
        }
        else {
          local_858._M_string_length = 0;
          local_858.field_2._M_local_buf[0] = '\0';
        }
        std::__cxx11::string::operator=((string *)pExt,(string *)&local_858);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_dataplus._M_p != paVar1) {
          operator_delete(local_858._M_dataplus._M_p,
                          CONCAT71(local_858.field_2._M_allocated_capacity._1_7_,
                                   local_858.field_2._M_local_buf[0]) + 1);
        }
        if (pExt->_M_string_length != 0) {
          std::operator+(&local_858,".",pExt);
          std::__cxx11::string::operator=((string *)pExt,(string *)&local_858);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_858._M_dataplus._M_p != paVar1) {
            operator_delete(local_858._M_dataplus._M_p,
                            CONCAT71(local_858.field_2._M_allocated_capacity._1_7_,
                                     local_858.field_2._M_local_buf[0]) + 1);
          }
        }
      }
    }
    return __s_00 != (char *)0x0 && __s != (char *)0x0;
  }
  __assert_fail("pDst && pSrc && dst_len",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0x465,"char *basisu::strcpy_safe(char *, size_t, const char *)");
}

Assistant:

inline bool string_split_path(const char *p, std::string *pDrive, std::string *pDir, std::string *pFilename, std::string *pExt)
	{
#ifdef _MSC_VER
		char drive_buf[_MAX_DRIVE] = { 0 };
		char dir_buf[_MAX_DIR] = { 0 };
		char fname_buf[_MAX_FNAME] = { 0 };
		char ext_buf[_MAX_EXT] = { 0 };

		errno_t error = _splitpath_s(p, 
			pDrive ? drive_buf : NULL, pDrive ? _MAX_DRIVE : 0,
			pDir ? dir_buf : NULL, pDir ? _MAX_DIR : 0,
			pFilename ? fname_buf : NULL, pFilename ? _MAX_FNAME : 0,
			pExt ? ext_buf : NULL, pExt ? _MAX_EXT : 0);
		if (error != 0)
			return false;

		if (pDrive) *pDrive = drive_buf;
		if (pDir) *pDir = dir_buf;
		if (pFilename) *pFilename = fname_buf;
		if (pExt) *pExt = ext_buf;
		return true;
#else
		char dirtmp[1024], nametmp[1024];
		strcpy_safe(dirtmp, sizeof(dirtmp), p);
		strcpy_safe(nametmp, sizeof(nametmp), p);

		if (pDrive)
			pDrive->resize(0);

		const char *pDirName = dirname(dirtmp);
		const char* pBaseName = basename(nametmp);
		if ((!pDirName) || (!pBaseName))
			return false;

		if (pDir)
		{
			*pDir = pDirName;
			if ((pDir->size()) && (pDir->back() != '/'))
				*pDir += "/";
		}
				
		if (pFilename)
		{
			*pFilename = pBaseName;
			string_remove_extension(*pFilename);
		}

		if (pExt)
		{
			*pExt = pBaseName;
			*pExt = string_get_extension(*pExt);
			if (pExt->size())
				*pExt = "." + *pExt;
		}

		return true;
#endif
	}